

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall
wasm::Wasm2JSBuilder::Wasm2JSBuilder(Wasm2JSBuilder *this,Flags *f,PassOptions *options_)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Index IVar11;
  undefined3 uVar12;
  Index IVar13;
  undefined1 uVar14;
  int iVar15;
  int iVar16;
  Index IVar17;
  undefined4 uVar18;
  __node_base_ptr *pp_Var19;
  __node_base_ptr *pp_Var20;
  long lVar21;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_38;
  __alloc_node_gen_t __alloc_node_gen;
  
  (this->dataIndices)._M_h._M_buckets = &(this->dataIndices)._M_h._M_single_bucket;
  (this->dataIndices)._M_h._M_bucket_count = 1;
  (this->dataIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataIndices)._M_h._M_element_count = 0;
  (this->dataIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar4 = f->pedantic;
  bVar5 = f->allowAsserts;
  bVar6 = f->emscripten;
  (this->flags).debug = f->debug;
  (this->flags).pedantic = bVar4;
  (this->flags).allowAsserts = bVar5;
  (this->flags).emscripten = bVar6;
  (this->flags).deterministic = f->deterministic;
  (this->flags).symbolsFile._M_dataplus._M_p = (pointer)&(this->flags).symbolsFile.field_2;
  pcVar1 = (f->symbolsFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->flags).symbolsFile,pcVar1,pcVar1 + (f->symbolsFile)._M_string_length)
  ;
  bVar4 = options_->trapsNeverHappen;
  bVar5 = options_->lowMemoryUnused;
  bVar6 = options_->fastMath;
  bVar7 = options_->zeroFilledMemory;
  bVar8 = options_->closedWorld;
  bVar9 = options_->debugInfo;
  bVar10 = options_->targetJS;
  (this->options).ignoreImplicitTraps = options_->ignoreImplicitTraps;
  (this->options).trapsNeverHappen = bVar4;
  (this->options).lowMemoryUnused = bVar5;
  (this->options).fastMath = bVar6;
  (this->options).zeroFilledMemory = bVar7;
  (this->options).closedWorld = bVar8;
  (this->options).debugInfo = bVar9;
  (this->options).targetJS = bVar10;
  bVar5 = options_->debug;
  bVar6 = options_->validate;
  bVar7 = options_->validateGlobally;
  uVar14 = options_->field_0x3;
  iVar15 = options_->optimizeLevel;
  iVar16 = options_->shrinkLevel;
  IVar17 = (options_->inlining).alwaysInlineMaxSize;
  IVar11 = (options_->inlining).flexibleInlineMaxSize;
  bVar4 = (options_->inlining).allowFunctionsWithLoops;
  uVar12 = *(undefined3 *)&(options_->inlining).field_0xd;
  IVar13 = (options_->inlining).partialInliningIfs;
  (this->options).inlining.oneCallerInlineMaxSize = (options_->inlining).oneCallerInlineMaxSize;
  (this->options).inlining.flexibleInlineMaxSize = IVar11;
  (this->options).inlining.allowFunctionsWithLoops = bVar4;
  *(undefined3 *)&(this->options).inlining.field_0xd = uVar12;
  (this->options).inlining.partialInliningIfs = IVar13;
  (this->options).debug = bVar5;
  (this->options).validate = bVar6;
  (this->options).validateGlobally = bVar7;
  (this->options).field_0x3 = uVar14;
  (this->options).optimizeLevel = iVar15;
  (this->options).shrinkLevel = iVar16;
  (this->options).inlining.alwaysInlineMaxSize = IVar17;
  local_38._M_h = (__hashtable_alloc *)&(this->options).arguments;
  (this->options).arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).arguments._M_h._M_bucket_count = (options_->arguments)._M_h._M_bucket_count;
  (this->options).arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).arguments._M_h._M_element_count = (options_->arguments)._M_h._M_element_count;
  uVar18 = *(undefined4 *)&(options_->arguments)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (options_->arguments)._M_h._M_rehash_policy._M_next_resize;
  (this->options).arguments._M_h._M_rehash_policy._M_max_load_factor =
       (options_->arguments)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).arguments._M_h._M_rehash_policy.field_0x4 = uVar18;
  (this->options).arguments._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->options).arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,&(options_->arguments)._M_h,&local_38);
  local_38._M_h = (__hashtable_alloc *)&(this->options).passesToSkip;
  (this->options).passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).passesToSkip._M_h._M_bucket_count = (options_->passesToSkip)._M_h._M_bucket_count;
  (this->options).passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).passesToSkip._M_h._M_element_count =
       (options_->passesToSkip)._M_h._M_element_count;
  uVar18 = *(undefined4 *)&(options_->passesToSkip)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (options_->passesToSkip)._M_h._M_rehash_policy._M_next_resize;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
       (options_->passesToSkip)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).passesToSkip._M_h._M_rehash_policy.field_0x4 = uVar18;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->options).passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_38._M_h,&(options_->passesToSkip)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_38);
  (this->options).funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (options_->funcEffectsMap).
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (options_->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->options).funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->frees).
  super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frees).
  super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frees).
  super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var19 = &this->wasmNameToMangledName[0]._M_h._M_single_bucket;
  lVar21 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var19 + -6))->_M_buckets = pp_Var19;
    pp_Var19[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var19 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var19[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var19 + -2))->_M_max_load_factor = 1.0;
    pp_Var19[-1] = (__node_base_ptr)0x0;
    *pp_Var19 = (__node_base_ptr)0x0;
    pp_Var19 = pp_Var19 + 7;
    lVar21 = lVar21 + -0x38;
  } while (lVar21 != 0);
  pp_Var20 = &this->mangledNames[0]._M_h._M_single_bucket;
  lVar21 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var20 + -6))->_M_buckets = pp_Var20;
    pp_Var20[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var20 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var20[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var20 + -2))->_M_max_load_factor = 1.0;
    pp_Var20[-1] = (__node_base_ptr)0x0;
    *pp_Var20 = (__node_base_ptr)0x0;
    pp_Var20 = pp_Var20 + 7;
    lVar21 = lVar21 + -0x38;
  } while (lVar21 != 0);
  (this->seenModuleImports)._M_h._M_buckets = &(this->seenModuleImports)._M_h._M_single_bucket;
  (this->seenModuleImports)._M_h._M_bucket_count = 1;
  (this->seenModuleImports)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->seenModuleImports)._M_h._M_element_count = 0;
  (this->seenModuleImports)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->seenModuleImports)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->seenModuleImports)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->functionsCallableFromOutside)._M_h._M_buckets =
       &(this->functionsCallableFromOutside)._M_h._M_single_bucket;
  (this->functionsCallableFromOutside)._M_h._M_bucket_count = 1;
  (this->functionsCallableFromOutside)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionsCallableFromOutside)._M_h._M_element_count = 0;
  (this->functionsCallableFromOutside)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionsCallableFromOutside)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionsCallableFromOutside)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < (this->options).optimizeLevel) {
    (this->options).ignoreImplicitTraps = true;
    (this->options).targetJS = true;
  }
  return;
}

Assistant:

Wasm2JSBuilder(Flags f, PassOptions options_) : flags(f), options(options_) {
    // We don't try to model wasm's trapping precisely - if we did, each load
    // and store would need to do a check. Given that, we can just ignore
    // implicit traps like those when optimizing. (When not optimizing, it's
    // nice to see codegen that matches wasm more precisely.)
    // It is also important to prevent the optimizer from adding new things that
    // require additional lowering, as we could hit a cycle.
    if (options.optimizeLevel > 0) {
      options.ignoreImplicitTraps = true;
      options.targetJS = true;
    }
  }